

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_ordered.h
# Opt level: O1

pair<std::_List_iterator<std::pair<const_wasm::Signature,_unsigned_long>_>,_bool> __thiscall
wasm::InsertOrderedMap<wasm::Signature,_unsigned_long>::insert
          (InsertOrderedMap<wasm::Signature,_unsigned_long> *this,
          pair<const_wasm::Signature,_unsigned_long> *kv)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::Signature,_std::_List_iterator<std::pair<const_wasm::Signature,_unsigned_long>_>_>,_false,_true>,_bool>
  pVar4;
  pair<std::_List_iterator<std::pair<const_wasm::Signature,_unsigned_long>_>,_bool> pVar5;
  
  pVar4 = std::
          _Hashtable<wasm::Signature,std::pair<wasm::Signature_const,std::_List_iterator<std::pair<wasm::Signature_const,unsigned_long>>>,std::allocator<std::pair<wasm::Signature_const,std::_List_iterator<std::pair<wasm::Signature_const,unsigned_long>>>>,std::__detail::_Select1st,std::equal_to<wasm::Signature>,std::hash<wasm::Signature>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::pair<wasm::Signature_const,std::_List_iterator<std::pair<wasm::Signature_const,unsigned_long>>>>
                    ();
  pVar5._8_4_ = pVar4._8_4_;
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    p_Var3 = (_List_node_base *)operator_new(0x28);
    p_Var2 = (_List_node_base *)(kv->first).results.id;
    p_Var3[1]._M_next = (_List_node_base *)(kv->first).params.id;
    p_Var3[1]._M_prev = p_Var2;
    p_Var3[2]._M_next = (_List_node_base *)kv->second;
    std::__detail::_List_node_base::_M_hook(p_Var3);
    psVar1 = &(this->List).
              super__List_base<std::pair<const_wasm::Signature,_unsigned_long>,_std::allocator<std::pair<const_wasm::Signature,_unsigned_long>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    *(_List_node_base **)
     ((long)pVar4.first.
            super__Node_iterator_base<std::pair<const_wasm::Signature,_std::_List_iterator<std::pair<const_wasm::Signature,_unsigned_long>_>_>,_true>
            ._M_cur.
            super__Node_iterator_base<std::pair<const_wasm::Signature,_std::_List_iterator<std::pair<const_wasm::Signature,_unsigned_long>_>_>,_true>
     + 0x18) = (this->List).
               super__List_base<std::pair<const_wasm::Signature,_unsigned_long>,_std::allocator<std::pair<const_wasm::Signature,_unsigned_long>_>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
  }
  pVar5.first._M_node =
       (_List_node_base *)
       *(undefined8 *)
        ((long)pVar4.first.
               super__Node_iterator_base<std::pair<const_wasm::Signature,_std::_List_iterator<std::pair<const_wasm::Signature,_unsigned_long>_>_>,_true>
               ._M_cur.
               super__Node_iterator_base<std::pair<const_wasm::Signature,_std::_List_iterator<std::pair<const_wasm::Signature,_unsigned_long>_>_>,_true>
        + 0x18);
  pVar5._12_4_ = 0;
  return pVar5;
}

Assistant:

std::pair<iterator, bool> insert(const std::pair<const Key, T>& kv) {
    // Try inserting with a placeholder list iterator.
    auto inserted = Map.insert({kv.first, List.end()});
    if (inserted.second) {
      // This is a new item; insert it in the list and update the iterator.
      List.push_back(kv);
      inserted.first->second = std::prev(List.end());
    }
    return {inserted.first->second, inserted.second};
  }